

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall
smf::Option_register::Option_register
          (Option_register *this,string *aDefinition,char aType,string *aDefaultOption)

{
  string *aDefaultOption_local;
  char aType_local;
  string *aDefinition_local;
  Option_register *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->m_description);
  std::__cxx11::string::string((string *)&this->m_defaultOption);
  std::__cxx11::string::string((string *)&this->m_modifiedOption);
  this->m_modifiedQ = false;
  setType(this,aType);
  setDefinition(this,aDefinition);
  setDefault(this,aDefaultOption);
  return;
}

Assistant:

Option_register::Option_register(const std::string& aDefinition, char aType,
		const std::string& aDefaultOption) {
	m_modifiedQ = false;
	setType(aType);
	setDefinition(aDefinition);
	setDefault(aDefaultOption);
}